

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_common.c
# Opt level: O1

uint8_t * apx_vm_parse_int64_by_variant(uint8_t *begin,uint8_t *end,uint8_t variant,int64_t *number)

{
  uint32_t uVar1;
  uint64_t uVar2;
  uint8_t *puVar3;
  
  uVar1 = apx_vm_variant_to_size(variant);
  if ((uVar1 == 0) || (puVar3 = begin + uVar1, end < puVar3)) {
    puVar3 = (uint8_t *)0x0;
  }
  else {
    uVar2 = unpackLE64(begin,(uint8_t)uVar1);
    *number = uVar2;
  }
  return puVar3;
}

Assistant:

uint8_t const* apx_vm_parse_int64_by_variant(uint8_t const* begin, uint8_t const* end, uint8_t variant, int64_t* number)
{
   uint8_t const* next = begin;
   uint8_t const unpack_size = (uint8_t)apx_vm_variant_to_size(variant);
   if ((unpack_size == 0) || (next + unpack_size) > end)
   {
      return NULL;
   }
   *number = (int64_t)unpackLE64(next, unpack_size);
   return next + unpack_size;
}